

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary.cpp
# Opt level: O2

int __thiscall CBoundary::AddWire(CBoundary *this,CWire *pWire)

{
  short sVar1;
  undefined4 uVar2;
  int iVar3;
  CLayer *pCVar4;
  short sVar5;
  CWire *pWire_local;
  
  pWire_local = pWire;
  if ((pWire->super_CObject).m_pParent == (CObject *)0x0) {
    __assert_fail("pWire->GetParent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                  ,0x89,"int CBoundary::AddWire(CWire *)");
  }
  if (((pWire->super_CObject).m_iState & 1) == 0) {
    __assert_fail("pWire->IsRouted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                  ,0x8a,"int CBoundary::AddWire(CWire *)");
  }
  iVar3 = CWire::IsFlat(pWire);
  if (iVar3 == 0) {
    __assert_fail("pWire->IsFlat()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                  ,0x8b,"int CBoundary::AddWire(CWire *)");
  }
  pCVar4 = CWire::GetLayer(pWire);
  iVar3 = CLayer::Z(pCVar4);
  if (iVar3 == (this->super_CPoint).m_cZ) {
    sVar1 = this->m_iCongestion;
    iVar3 = IsFound(this,pWire);
    if (iVar3 != 0) {
      __assert_fail("!IsFound(pWire)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                    ,0x92,"int CBoundary::AddWire(CWire *)");
    }
    std::vector<CWire_*,_std::allocator<CWire_*>_>::push_back(&this->m_Wire,&pWire_local);
    iVar3 = IsFound(this,pWire_local);
    if (iVar3 != 0) {
      uVar2 = *(undefined4 *)&(this->super_CPoint).field_0x26;
      sVar5 = (short)uVar2 + 2;
      *(uint *)&(this->super_CPoint).field_0x26 = CONCAT22((short)((uint)uVar2 >> 0x10) + -2,sVar5);
      pCVar4 = (CLayer *)(this->super_CPoint).super_CObject.m_pParent;
      sVar5 = (short)((sVar5 * 100) / pCVar4->m_iMaxCapacity);
      this->m_iCongestion = sVar5;
      CLayer::TrackCongestion(pCVar4,this,(int)sVar1,(int)sVar5);
      return 1;
    }
    __assert_fail("IsFound(pWire)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                  ,0x96,"int CBoundary::AddWire(CWire *)");
  }
  __assert_fail("pWire->GetLayer()->Z()==Z()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Boundary.cpp"
                ,0x8c,"int CBoundary::AddWire(CWire *)");
}

Assistant:

int CBoundary::AddWire(CWire *pWire)
{
	//!this is called from CNet::Addwire when a new *ROUTED* wire is added
	assert(pWire->GetParent());
	assert(pWire->IsRouted());
	assert(pWire->IsFlat());
	assert(pWire->GetLayer()->Z()==Z());

	//save old congestion number for TrackCongestion
	int		iOldC	=	GetCongestion();

	// each boundary has only one single pass from every net [6/30/2006 thyeros]
	assert(!IsFound(pWire));

	m_Wire.push_back(pWire);

	assert(IsFound(pWire));

    //! Notice: Did the same thing with @ref AdjustCapacity()
	// update occupied capacity [2/9/2007 thyeros]
	m_iNumOCap		+=	WIRE_WIDTH_SPACE;//(pWire->GetParent()->GetWidth()+GetParent()->GetDesignRule(GET_DR_MIN_WIR_SPACING));
	m_iNumACap		-=	WIRE_WIDTH_SPACE;//GetParent()->GetCapacity(GET_MODE_MAX)-m_iNumOCap;
	m_iCongestion	=	100*m_iNumOCap/GetParent()->m_iMaxCapacity;

	//update the congestion statictics in the parent layer
	GetParent()->TrackCongestion(this,iOldC,m_iCongestion);

	return	TRUE;
}